

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSAX2StartElementNs(void)

{
  int iVar1;
  int iVar2;
  int val;
  int val_00;
  void *val_01;
  xmlChar *val_02;
  xmlChar *val_03;
  xmlChar *val_04;
  xmlChar **val_05;
  xmlChar **val_06;
  int local_84;
  int n_attributes;
  xmlChar **attributes;
  int n_nb_defaulted;
  int nb_defaulted;
  int n_nb_attributes;
  int nb_attributes;
  int n_namespaces;
  xmlChar **namespaces;
  int n_nb_namespaces;
  int nb_namespaces;
  int n_URI;
  xmlChar *URI;
  int n_prefix;
  xmlChar *prefix;
  int n_localname;
  xmlChar *localname;
  int n_ctx;
  void *ctx;
  int mem_base;
  int test_ret;
  
  ctx._4_4_ = 0;
  for (localname._4_4_ = 0; (int)localname._4_4_ < 2; localname._4_4_ = localname._4_4_ + 1) {
    for (prefix._4_4_ = 0; (int)prefix._4_4_ < 5; prefix._4_4_ = prefix._4_4_ + 1) {
      for (URI._4_4_ = 0; (int)URI._4_4_ < 5; URI._4_4_ = URI._4_4_ + 1) {
        for (n_nb_namespaces = 0; n_nb_namespaces < 5; n_nb_namespaces = n_nb_namespaces + 1) {
          for (namespaces._4_4_ = 0; (int)namespaces._4_4_ < 4;
              namespaces._4_4_ = namespaces._4_4_ + 1) {
            for (n_nb_attributes = 0; n_nb_attributes < 1; n_nb_attributes = n_nb_attributes + 1) {
              for (n_nb_defaulted = 0; n_nb_defaulted < 4; n_nb_defaulted = n_nb_defaulted + 1) {
                for (attributes._4_4_ = 0; (int)attributes._4_4_ < 4;
                    attributes._4_4_ = attributes._4_4_ + 1) {
                  for (local_84 = 0; local_84 < 1; local_84 = local_84 + 1) {
                    iVar1 = xmlMemBlocks();
                    val_01 = gen_void_ptr(localname._4_4_,0);
                    val_02 = gen_const_xmlChar_ptr(prefix._4_4_,1);
                    val_03 = gen_const_xmlChar_ptr(URI._4_4_,2);
                    val_04 = gen_const_xmlChar_ptr(n_nb_namespaces,3);
                    iVar2 = gen_int(namespaces._4_4_,4);
                    val_05 = gen_const_xmlChar_ptr_ptr(n_nb_attributes,5);
                    val = gen_int(n_nb_defaulted,6);
                    val_00 = gen_int(attributes._4_4_,7);
                    val_06 = gen_const_xmlChar_ptr_ptr(local_84,8);
                    xmlSAX2StartElementNs
                              (val_01,val_02,val_03,val_04,iVar2,val_05,val,val_00,val_06);
                    call_tests = call_tests + 1;
                    des_void_ptr(localname._4_4_,val_01,0);
                    des_const_xmlChar_ptr(prefix._4_4_,val_02,1);
                    des_const_xmlChar_ptr(URI._4_4_,val_03,2);
                    des_const_xmlChar_ptr(n_nb_namespaces,val_04,3);
                    des_int(namespaces._4_4_,iVar2,4);
                    des_const_xmlChar_ptr_ptr(n_nb_attributes,val_05,5);
                    des_int(n_nb_defaulted,val,6);
                    des_int(attributes._4_4_,val_00,7);
                    des_const_xmlChar_ptr_ptr(local_84,val_06,8);
                    xmlResetLastError();
                    iVar2 = xmlMemBlocks();
                    if (iVar1 != iVar2) {
                      iVar2 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlSAX2StartElementNs",
                             (ulong)(uint)(iVar2 - iVar1));
                      ctx._4_4_ = ctx._4_4_ + 1;
                      printf(" %d",(ulong)localname._4_4_);
                      printf(" %d",(ulong)prefix._4_4_);
                      printf(" %d",(ulong)URI._4_4_);
                      printf(" %d",(ulong)(uint)n_nb_namespaces);
                      printf(" %d",(ulong)namespaces._4_4_);
                      printf(" %d",(ulong)(uint)n_nb_attributes);
                      printf(" %d",(ulong)(uint)n_nb_defaulted);
                      printf(" %d",(ulong)attributes._4_4_);
                      printf(" %d");
                      printf("\n");
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ctx._4_4_;
}

Assistant:

static int
test_xmlSAX2StartElementNs(void) {
    int test_ret = 0;

    int mem_base;
    void * ctx; /* the user data (XML parser context) */
    int n_ctx;
    const xmlChar * localname; /* the local name of the element */
    int n_localname;
    const xmlChar * prefix; /* the element namespace prefix if available */
    int n_prefix;
    const xmlChar * URI; /* the element namespace name if available */
    int n_URI;
    int nb_namespaces; /* number of namespace definitions on that node */
    int n_nb_namespaces;
    const xmlChar ** namespaces; /* pointer to the array of prefix/URI pairs namespace definitions */
    int n_namespaces;
    int nb_attributes; /* the number of attributes on that node */
    int n_nb_attributes;
    int nb_defaulted; /* the number of defaulted attributes. */
    int n_nb_defaulted;
    const xmlChar ** attributes; /* pointer to the array of (localname/prefix/URI/value/end) attribute values. */
    int n_attributes;

    for (n_ctx = 0;n_ctx < gen_nb_void_ptr;n_ctx++) {
    for (n_localname = 0;n_localname < gen_nb_const_xmlChar_ptr;n_localname++) {
    for (n_prefix = 0;n_prefix < gen_nb_const_xmlChar_ptr;n_prefix++) {
    for (n_URI = 0;n_URI < gen_nb_const_xmlChar_ptr;n_URI++) {
    for (n_nb_namespaces = 0;n_nb_namespaces < gen_nb_int;n_nb_namespaces++) {
    for (n_namespaces = 0;n_namespaces < gen_nb_const_xmlChar_ptr_ptr;n_namespaces++) {
    for (n_nb_attributes = 0;n_nb_attributes < gen_nb_int;n_nb_attributes++) {
    for (n_nb_defaulted = 0;n_nb_defaulted < gen_nb_int;n_nb_defaulted++) {
    for (n_attributes = 0;n_attributes < gen_nb_const_xmlChar_ptr_ptr;n_attributes++) {
        mem_base = xmlMemBlocks();
        ctx = gen_void_ptr(n_ctx, 0);
        localname = gen_const_xmlChar_ptr(n_localname, 1);
        prefix = gen_const_xmlChar_ptr(n_prefix, 2);
        URI = gen_const_xmlChar_ptr(n_URI, 3);
        nb_namespaces = gen_int(n_nb_namespaces, 4);
        namespaces = gen_const_xmlChar_ptr_ptr(n_namespaces, 5);
        nb_attributes = gen_int(n_nb_attributes, 6);
        nb_defaulted = gen_int(n_nb_defaulted, 7);
        attributes = gen_const_xmlChar_ptr_ptr(n_attributes, 8);

        xmlSAX2StartElementNs(ctx, localname, prefix, URI, nb_namespaces, namespaces, nb_attributes, nb_defaulted, attributes);
        call_tests++;
        des_void_ptr(n_ctx, ctx, 0);
        des_const_xmlChar_ptr(n_localname, localname, 1);
        des_const_xmlChar_ptr(n_prefix, prefix, 2);
        des_const_xmlChar_ptr(n_URI, URI, 3);
        des_int(n_nb_namespaces, nb_namespaces, 4);
        des_const_xmlChar_ptr_ptr(n_namespaces, namespaces, 5);
        des_int(n_nb_attributes, nb_attributes, 6);
        des_int(n_nb_defaulted, nb_defaulted, 7);
        des_const_xmlChar_ptr_ptr(n_attributes, attributes, 8);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSAX2StartElementNs",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctx);
            printf(" %d", n_localname);
            printf(" %d", n_prefix);
            printf(" %d", n_URI);
            printf(" %d", n_nb_namespaces);
            printf(" %d", n_namespaces);
            printf(" %d", n_nb_attributes);
            printf(" %d", n_nb_defaulted);
            printf(" %d", n_attributes);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}